

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_wsh_extkey_derive_Test::Descriptor_Parse_wsh_extkey_derive_Test
          (Descriptor_Parse_wsh_extkey_derive_Test *this)

{
  Descriptor_Parse_wsh_extkey_derive_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__Descriptor_Parse_wsh_extkey_derive_Test_00888a48;
  return;
}

Assistant:

TEST(Descriptor, Parse_wsh_extkey_derive) {
  std::string descriptor = "wsh(multi(1,xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/*,xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/*))";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  Script gen_script;
  std::vector<DescriptorScriptReference> script_list;
  std::vector<DescriptorScriptReference> script_list2;

  try {
    desc = Descriptor::Parse(descriptor);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
  std::vector<std::string> arg_list1;
  std::vector<std::string> arg_list2;
  arg_list1.push_back("0");
  arg_list1.push_back("0");
  arg_list2.push_back("0/44");
  arg_list2.push_back("0/44");
  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_THROW(locking_script = desc.GetLockingScript(), CfdException);
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript("0"));
  EXPECT_NO_THROW(gen_script = desc.GetLockingScript(arg_list2));
  EXPECT_NO_THROW(script_list = desc.GetReferenceAll(&arg_list1));
  EXPECT_NO_THROW(script_list2 = desc.GetReferenceAll(&arg_list2));
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
    "0 64969d8cdca2aa0bb72cfe88427612878db98a5f07f9a7ec6ec87b85e9f9208b");
  EXPECT_STREQ(gen_script.ToString().c_str(),
    "0 2070830c75de894b00286a87cbbb201aaec3487b5891dbf657c0500e11efa27d");

  EXPECT_EQ(script_list.size(), 1);
  if (script_list.size() == 1) {
    EXPECT_TRUE(script_list[0].HasAddress());
    EXPECT_STREQ(script_list[0].GenerateAddress(NetType::kMainnet).GetAddress().c_str(),
      "bc1qvjtfmrxu524qhdevl6yyyasjs7xmnzjlqlu60mrwepact60eyz9s9xjw0c");
    EXPECT_EQ(script_list[0].GetAddressType(), AddressType::kP2wshAddress);
    EXPECT_EQ(script_list[0].GetHashType(), HashType::kP2wsh);
    EXPECT_EQ(script_list[0].GetScriptType(), DescriptorScriptType::kDescriptorScriptWsh);

    EXPECT_TRUE(script_list[0].HasChild());
    EXPECT_STREQ(script_list[0].GetRedeemScript().ToString().c_str(),
      "1 0205f8f73d8a553ad3287a506dbd53ed176cadeb200c8e4f7d68a001b1aed87106 02c04c4e03921809fcbef9a26da2d62b19b2b4eb383b3e6cfaaef6370e75144774 2 OP_CHECKMULTISIG");
    EXPECT_FALSE(script_list[0].GetChild().HasChild());
    EXPECT_TRUE(script_list[0].GetChild().HasKey());
    EXPECT_EQ(script_list[0].GetChild().GetKeyNum(), 2);
    std::vector<DescriptorKeyReference> keys = script_list[0].GetChild().GetKeyList();
    if (keys.size() == 2) {
      EXPECT_STREQ(keys[0].GetPubkey().GetHex().c_str(),
        "0205f8f73d8a553ad3287a506dbd53ed176cadeb200c8e4f7d68a001b1aed87106");
      EXPECT_TRUE(keys[0].HasExtPubkey());
      EXPECT_STREQ(keys[0].GetExtPubkey().ToString().c_str(),
        "xpub6BgWskLoyHmAUeKWgUXCGfDdCMRXseEjRCMEMvjkedmHpnvWtpXMaCRm8qcADw9einPR8o2c49ZpeHRZP4uYwGeMU2T63G7uf2Y1qJavrWQ");
      EXPECT_FALSE(keys[0].HasExtPrivkey());
      EXPECT_THROW(keys[0].GetExtPrivkey(), CfdException);
      EXPECT_STREQ(keys[0].GetArgument().c_str(), "0");
      EXPECT_STREQ(keys[1].GetPubkey().GetHex().c_str(),
        "02c04c4e03921809fcbef9a26da2d62b19b2b4eb383b3e6cfaaef6370e75144774");
      EXPECT_STREQ(keys[1].GetExtPubkey().ToString().c_str(),
        "xpub6EKMC2gSMfKgQJ3iNMZVNB4GLH1Dc4hNPah1iMbbztxdUPRo84MMcTgkPATWNRyzr7WifKrt5VvQi4GEqRwybCP1LHoXBKLN6cB15HuBKPE");
      EXPECT_EQ(keys[1].GetKeyType(), DescriptorKeyType::kDescriptorKeyBip32);
    }
  }

  EXPECT_EQ(script_list2.size(), 1);
  if (script_list2.size() == 1) {
    EXPECT_STREQ(script_list2[0].GetRedeemScript().ToString().c_str(),
      "1 026e636c42ce086d19aae89eca84e95d568bad8a166b9e99b0e27041caab905f38 02bbd047b8f3dac46297e337fb91043fb7c211be89e6068f156e065ebe7fcca01c 2 OP_CHECKMULTISIG");
    std::vector<DescriptorKeyReference> keys = script_list2[0].GetChild().GetKeyList();
    if (keys.size() == 2) {
      EXPECT_STREQ(keys[0].GetArgument().c_str(), "0/44");
    }
    std::vector<Address> addresses = script_list2[0].GetChild()
        .GenerateAddresses(NetType::kMainnet);
    EXPECT_EQ(addresses.size(), 2);
    if (addresses.size() == 2) {
      EXPECT_STREQ(addresses[0].GetAddress().c_str(),
          "13HW6r2TPu5MULn8Do8TpvZs2qeARv1ZBA");
      EXPECT_STREQ(addresses[1].GetAddress().c_str(),
          "17jeEcwRN7u1W9KoRwpHFbCyyij478uvXF");
    }
  }
}